

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Path.h
# Opt level: O3

Path * __thiscall Path::ensureTrailingSlash(Path *__return_storage_ptr__,Path *this)

{
  pointer pcVar1;
  size_type sVar2;
  size_t s;
  String ret;
  undefined1 *local_38;
  long local_30;
  undefined1 local_28 [16];
  
  pcVar1 = (this->super_String).mString._M_dataplus._M_p;
  sVar2 = (this->super_String).mString._M_string_length;
  if ((sVar2 == 0) || (pcVar1[sVar2 - 1] == '/')) {
    (__return_storage_ptr__->super_String).mString._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->super_String).mString.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar1,pcVar1 + sVar2);
  }
  else {
    local_38 = local_28;
    std::__cxx11::string::_M_construct<char*>((string *)&local_38,pcVar1,pcVar1 + sVar2);
    std::__cxx11::string::push_back((char)&local_38);
    (__return_storage_ptr__->super_String).mString._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->super_String).mString.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,local_38,local_38 + local_30);
    if (local_38 != local_28) {
      operator_delete(local_38);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

inline Path ensureTrailingSlash() const
    {
        if (!isEmpty() && !endsWith('/'))
            return *this + '/';
        return *this;
    }